

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void * tdefl_write_image_to_png_file_in_memory_ex
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out,mz_uint level,mz_bool flip
                 )

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  tdefl_status tVar4;
  mz_bool mVar5;
  tdefl_compressor *d;
  void *pvVar6;
  ulong uVar7;
  size_t sVar8;
  mz_ulong mVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  tdefl_output_buffer out_buf;
  int local_ac;
  ulong local_a8;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  undefined1 uStack_90;
  undefined7 uStack_8f;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined2 uStack_84;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 uStack_80;
  uint uStack_7f;
  byte bStack_7b;
  undefined2 uStack_7a;
  undefined1 uStack_78;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined4 local_73;
  undefined1 local_68 [24];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  size_t *local_40;
  void *local_38;
  
  local_38 = pImage;
  d = (tdefl_compressor *)malloc(0x4df78);
  *pLen_out = 0;
  if (d != (tdefl_compressor *)0x0) {
    iVar11 = num_chans * w;
    local_68._16_8_ = 0;
    local_68._0_16_ = ZEXT816(0) << 0x40;
    uStack_50 = 1;
    iVar2 = (iVar11 + 1) * h;
    iVar12 = 0x40;
    if (0x40 < iVar2) {
      iVar12 = iVar2;
    }
    local_68._0_16_ = ZEXT416(iVar12 + 0x39U) << 0x40;
    uStack_4c = 0;
    local_a8 = (ulong)(uint)h;
    local_9c = w;
    pvVar6 = malloc((ulong)(iVar12 + 0x39U));
    local_68._16_8_ = pvVar6;
    if (pvVar6 != (void *)0x0) {
      local_ac = 0x29;
      local_a0 = num_chans;
      local_40 = pLen_out;
      do {
        (anonymous_namespace)::miniz::tdefl_output_buffer_putter(&local_ac,1,local_68);
        local_ac = local_ac + -1;
      } while (local_ac != 0);
      uVar7 = 10;
      if (level < 10) {
        uVar7 = (ulong)level;
      }
      tdefl_init(d,(anonymous_namespace)::miniz::tdefl_output_buffer_putter,local_68,
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar7] | 0x1000)
      ;
      pvVar6 = local_38;
      if (0 < (int)local_a8) {
        iVar2 = 0;
        iVar12 = (int)local_a8;
        do {
          iVar12 = iVar12 + -1;
          tdefl_compress_buffer(d,&local_ac,1,TDEFL_NO_FLUSH);
          iVar3 = iVar12;
          if (flip == 0) {
            iVar3 = iVar2;
          }
          tdefl_compress_buffer
                    (d,(void *)((long)(iVar3 * iVar11) + (long)pvVar6),(long)iVar11,TDEFL_NO_FLUSH);
          iVar2 = iVar2 + 1;
        } while (iVar12 != 0);
      }
      tVar4 = tdefl_compress_buffer(d,(void *)0x0,0,TDEFL_FINISH);
      psVar1 = local_40;
      if (tVar4 == TDEFL_STATUS_DONE) {
        sVar8 = local_68._0_8_ - 0x29;
        *local_40 = sVar8;
        local_98 = 0xa1a0a0d474e5089;
        uStack_90 = 0;
        uStack_8f = 0x524448490d0000;
        uStack_88 = 0;
        uStack_87 = 0;
        uStack_86 = (undefined1)((uint)local_9c >> 8);
        uStack_85 = (undefined1)local_9c;
        uStack_84 = 0;
        uStack_82 = (undefined1)(local_a8 >> 8);
        uStack_81 = (undefined1)local_a8;
        uStack_80 = 8;
        uStack_7f = (uint)""[local_a0];
        bStack_7b = 0;
        uStack_7a = 0;
        uStack_78 = 0;
        local_77 = (undefined1)(sVar8 >> 0x18);
        local_76 = (undefined1)(sVar8 >> 0x10);
        local_75 = (undefined1)(sVar8 >> 8);
        local_74 = (undefined1)sVar8;
        local_73 = 0x54414449;
        uVar13 = 0xffffffff;
        lVar10 = -0x11;
        do {
          uVar13 = uVar13 >> 4 ^ mz_crc32::s_crc32[(uVar13 ^ (&bStack_7b)[lVar10]) & 0xf];
          uVar13 = uVar13 >> 4 ^ mz_crc32::s_crc32[(uint)((&bStack_7b)[lVar10] >> 4) ^ uVar13 & 0xf]
          ;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0);
        uVar13 = ~uVar13;
        lVar10 = 0x1d;
        do {
          *(char *)((long)&local_98 + lVar10) = (char)(uVar13 >> 0x18);
          uVar13 = uVar13 << 8;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x21);
        *(undefined8 *)(local_68._16_8_ + 9) = 0x524448490d0000;
        *(ulong *)(local_68._16_8_ + 0x11) =
             CONCAT17(8,CONCAT16(uStack_81,
                                 CONCAT15(uStack_82,(uint5)CONCAT11(uStack_85,uStack_86) << 8)));
        *(ulong *)(local_68._16_8_ + 0x19) =
             CONCAT17(uStack_78,CONCAT25(uStack_7a,CONCAT14(bStack_7b,uStack_7f)));
        *(ulong *)(local_68._16_8_ + 0x21) =
             CONCAT44(0x54414449,CONCAT13(local_74,CONCAT12(local_75,CONCAT11(local_76,local_77))));
        *(undefined8 *)local_68._16_8_ = 0xa1a0a0d474e5089;
        *(undefined8 *)(local_68._16_8_ + 8) = 0x524448490d000000;
        *(ulong *)(local_68._16_8_ + 0x10) =
             CONCAT17(uStack_81,CONCAT16(uStack_82,(uint6)CONCAT11(uStack_85,uStack_86) << 0x10));
        *(ulong *)(local_68._16_8_ + 0x18) =
             CONCAT26(uStack_7a,CONCAT15(bStack_7b,CONCAT41(uStack_7f,8)));
        mVar5 = (anonymous_namespace)::miniz::tdefl_output_buffer_putter("",0x10,local_68);
        if (mVar5 != 0) {
          lVar10 = 0;
          mVar9 = mz_crc32(0,(mz_uint8 *)(local_68._16_8_ + 0x25),*psVar1 + 4);
          do {
            *(char *)(lVar10 + -0x10 + local_68._16_8_ + local_68._0_8_) = (char)(mVar9 >> 0x18);
            lVar10 = lVar10 + 1;
            mVar9 = (mz_ulong)(uint)((int)mVar9 << 8);
          } while (lVar10 != 4);
          *psVar1 = *psVar1 + 0x39;
          free(d);
          return (void *)local_68._16_8_;
        }
        *psVar1 = 0;
      }
      free(d);
      d = (tdefl_compressor *)local_68._16_8_;
    }
    free(d);
  }
  return (void *)0x0;
}

Assistant:

void *tdefl_write_image_to_png_file_in_memory_ex(const void *pImage, int w,
                                                 int h, int num_chans,
                                                 size_t *pLen_out,
                                                 mz_uint level, mz_bool flip) {
  // Using a local copy of this array here in case MINIZ_NO_ZLIB_APIS was
  // defined.
  static const mz_uint s_tdefl_png_num_probes[11] = {
      0, 1, 6, 32, 16, 32, 128, 256, 512, 768, 1500};
  tdefl_compressor *pComp =
      (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor));
  tdefl_output_buffer out_buf;
  int i, bpl = w * num_chans, y, z;
  mz_uint32 c;
  *pLen_out = 0;
  if (!pComp)
    return NULL;
  MZ_CLEAR_OBJ(out_buf);
  out_buf.m_expandable = MZ_TRUE;
  out_buf.m_capacity = 57 + MZ_MAX(64, (1 + bpl) * h);
  if (NULL == (out_buf.m_pBuf = (mz_uint8 *)MZ_MALLOC(out_buf.m_capacity))) {
    MZ_FREE(pComp);
    return NULL;
  }
  // write dummy header
  for (z = 41; z; --z)
    tdefl_output_buffer_putter(&z, 1, &out_buf);
  // compress image data
  tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf,
             s_tdefl_png_num_probes[MZ_MIN(10, level)] |
                 TDEFL_WRITE_ZLIB_HEADER);
  for (y = 0; y < h; ++y) {
    tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH);
    tdefl_compress_buffer(pComp,
                          (mz_uint8 *)pImage + (flip ? (h - 1 - y) : y) * bpl,
                          bpl, TDEFL_NO_FLUSH);
  }
  if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) !=
      TDEFL_STATUS_DONE) {
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  // write real header
  *pLen_out = out_buf.m_size - 41;
  {
    static const mz_uint8 chans[] = {0x00, 0x00, 0x04, 0x02, 0x06};
    mz_uint8 pnghdr[41] = {
        0x89, 0x50, 0x4e, 0x47, 0x0d, 0x0a, 0x1a, 0x0a, 0x00, 0x00, 0x00, 0x0d,
        0x49, 0x48, 0x44, 0x52, 0, 0, (mz_uint8)(w >> 8), (mz_uint8)w, 0, 0,
        (mz_uint8)(h >> 8), (mz_uint8)h, 8, chans[num_chans], 0, 0, 0, 0, 0, 0,
        0, (mz_uint8)(*pLen_out >> 24), (mz_uint8)(*pLen_out >> 16),
        (mz_uint8)(*pLen_out >> 8), (mz_uint8)*pLen_out, 0x49, 0x44, 0x41,
        0x54};
    c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, pnghdr + 12, 17);
    for (i = 0; i < 4; ++i, c <<= 8)
      ((mz_uint8 *)(pnghdr + 29))[i] = (mz_uint8)(c >> 24);
    memcpy(out_buf.m_pBuf, pnghdr, 41);
  }
  // write footer (IDAT CRC-32, followed by IEND chunk)
  if (!tdefl_output_buffer_putter(
          "\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf)) {
    *pLen_out = 0;
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, out_buf.m_pBuf + 41 - 4,
                          *pLen_out + 4);
  for (i = 0; i < 4; ++i, c <<= 8)
    (out_buf.m_pBuf + out_buf.m_size - 16)[i] = (mz_uint8)(c >> 24);
  // compute final size of file, grab compressed data buffer and return
  *pLen_out += 57;
  MZ_FREE(pComp);
  return out_buf.m_pBuf;
}